

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts3ExprBalance(Fts3Expr **pp,int nMaxDepth)

{
  u64 n;
  int iVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  void *__s;
  long lVar5;
  Fts3Expr **ppFVar6;
  Fts3Expr *pFVar7;
  Fts3Expr *pFVar8;
  Fts3Expr *p;
  Fts3Expr *pFVar9;
  ulong uVar10;
  long in_FS_OFFSET;
  bool bVar11;
  Fts3Expr *pRight;
  Fts3Expr *pLeft;
  Fts3Expr *local_68;
  Fts3Expr *local_48;
  Fts3Expr *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_68 = *pp;
  if (nMaxDepth == 0) {
    iVar3 = 1;
  }
  else {
    iVar1 = local_68->eType;
    if (iVar1 - 3U < 2) {
      n = (long)nMaxDepth * 8;
      iVar3 = sqlite3_initialize();
      if (iVar3 == 0) {
        __s = sqlite3Malloc(n);
      }
      else {
        __s = (void *)0x0;
      }
      if (__s == (void *)0x0) {
        iVar3 = 7;
      }
      else {
        memset(__s,0,n);
        iVar3 = local_68->eType;
        local_40 = local_68;
        while (iVar3 == iVar1) {
          local_40 = local_40->pLeft;
          iVar3 = local_40->eType;
        }
        pFVar8 = (Fts3Expr *)0x0;
        do {
          p = local_40->pParent;
          local_40->pParent = (Fts3Expr *)0x0;
          if (p == (Fts3Expr *)0x0) {
            local_68 = (Fts3Expr *)0x0;
          }
          else {
            p->pLeft = (Fts3Expr *)0x0;
          }
          iVar4 = fts3ExprBalance(&local_40,nMaxDepth + -1);
          if (iVar4 == 0) {
            bVar11 = local_40 != (Fts3Expr *)0x0;
            if (bVar11 && 0 < nMaxDepth) {
              lVar5 = 1;
              pFVar7 = local_40;
              do {
                pFVar9 = *(Fts3Expr **)((long)__s + lVar5 * 8 + -8);
                if (pFVar9 == (Fts3Expr *)0x0) {
                  local_40 = (Fts3Expr *)0x0;
                }
                else {
                  pFVar8->pLeft = pFVar9;
                  pFVar8->pRight = pFVar7;
                  pFVar9->pParent = pFVar8;
                  pFVar7->pParent = pFVar8;
                  pFVar9 = pFVar8->pParent;
                  pFVar8->pParent = (Fts3Expr *)0x0;
                  pFVar7 = (Fts3Expr *)0x0;
                  local_40 = pFVar8;
                  pFVar8 = pFVar9;
                }
                *(Fts3Expr **)((long)__s + lVar5 * 8 + -8) = pFVar7;
                bVar11 = local_40 != (Fts3Expr *)0x0;
              } while ((bVar11) &&
                      (bVar2 = lVar5 < nMaxDepth, lVar5 = lVar5 + 1, pFVar7 = local_40, bVar2));
            }
            if (bVar11) {
              sqlite3Fts3ExprFree(local_40);
              iVar4 = 0x12;
              goto LAB_001caf79;
            }
            iVar3 = 0;
            iVar4 = 0;
            if (p == (Fts3Expr *)0x0) goto LAB_001caf79;
            ppFVar6 = &p->pRight;
            do {
              local_40 = *ppFVar6;
              ppFVar6 = &local_40->pLeft;
            } while (local_40->eType == iVar1);
            pFVar7 = p->pRight;
            pFVar7->pParent = p->pParent;
            if (p->pParent != (Fts3Expr *)0x0) {
              p->pParent->pLeft = pFVar7;
              pFVar7 = local_68;
            }
            local_68 = pFVar7;
            p->pParent = pFVar8;
            bVar11 = true;
          }
          else {
LAB_001caf79:
            iVar3 = iVar4;
            p = pFVar8;
            bVar11 = false;
          }
          pFVar8 = p;
        } while (bVar11);
        if (iVar3 == 0) {
          if (nMaxDepth < 1) {
            local_68 = (Fts3Expr *)0x0;
            local_40 = local_68;
          }
          else {
            uVar10 = 0;
            pFVar8 = (Fts3Expr *)0x0;
            do {
              pFVar7 = *(Fts3Expr **)((long)__s + uVar10 * 8);
              local_68 = pFVar8;
              pFVar9 = p;
              if (pFVar7 != (Fts3Expr *)0x0) {
                local_68 = pFVar7;
                if (pFVar8 != (Fts3Expr *)0x0) {
                  p->pRight = pFVar8;
                  pFVar7 = *(Fts3Expr **)((long)__s + uVar10 * 8);
                  p->pLeft = pFVar7;
                  pFVar7->pParent = p;
                  pFVar8->pParent = p;
                  pFVar9 = p->pParent;
                  local_68 = p;
                }
                local_68->pParent = (Fts3Expr *)0x0;
              }
              uVar10 = uVar10 + 1;
              pFVar8 = local_68;
              p = pFVar9;
              local_40 = local_68;
            } while ((uint)nMaxDepth != uVar10);
          }
        }
        else {
          if (0 < nMaxDepth) {
            uVar10 = 0;
            do {
              sqlite3Fts3ExprFree(*(Fts3Expr **)((long)__s + uVar10 * 8));
              uVar10 = uVar10 + 1;
            } while ((uint)nMaxDepth != uVar10);
          }
          while (p != (Fts3Expr *)0x0) {
            pFVar8 = p->pParent;
            sqlite3_free(p);
            p = pFVar8;
          }
        }
        sqlite3_free(__s);
      }
    }
    else {
      iVar3 = 0;
      if (iVar1 == 2) {
        local_40 = local_68->pLeft;
        local_48 = local_68->pRight;
        local_68->pLeft = (Fts3Expr *)0x0;
        local_68->pRight = (Fts3Expr *)0x0;
        local_40->pParent = (Fts3Expr *)0x0;
        local_48->pParent = (Fts3Expr *)0x0;
        iVar3 = fts3ExprBalance(&local_40,nMaxDepth + -1);
        if (iVar3 == 0) {
          iVar3 = fts3ExprBalance(&local_48,nMaxDepth + -1);
        }
        if (iVar3 == 0) {
          local_68->pLeft = local_40;
          local_40->pParent = local_68;
          local_68->pRight = local_48;
          local_48->pParent = local_68;
        }
        else {
          sqlite3Fts3ExprFree(local_48);
          sqlite3Fts3ExprFree(local_40);
        }
      }
    }
  }
  if (iVar3 != 0) {
    sqlite3Fts3ExprFree(local_68);
    local_68 = (Fts3Expr *)0x0;
  }
  *pp = local_68;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar3;
}

Assistant:

static int fts3ExprBalance(Fts3Expr **pp, int nMaxDepth){
  int rc = SQLITE_OK;             /* Return code */
  Fts3Expr *pRoot = *pp;          /* Initial root node */
  Fts3Expr *pFree = 0;            /* List of free nodes. Linked by pParent. */
  int eType = pRoot->eType;       /* Type of node in this tree */

  if( nMaxDepth==0 ){
    rc = SQLITE_ERROR;
  }

  if( rc==SQLITE_OK ){
    if( (eType==FTSQUERY_AND || eType==FTSQUERY_OR) ){
      Fts3Expr **apLeaf;
      apLeaf = (Fts3Expr **)sqlite3_malloc64(sizeof(Fts3Expr *) * nMaxDepth);
      if( 0==apLeaf ){
        rc = SQLITE_NOMEM;
      }else{
        memset(apLeaf, 0, sizeof(Fts3Expr *) * nMaxDepth);
      }

      if( rc==SQLITE_OK ){
        int i;
        Fts3Expr *p;

        /* Set $p to point to the left-most leaf in the tree of eType nodes. */
        for(p=pRoot; p->eType==eType; p=p->pLeft){
          assert( p->pParent==0 || p->pParent->pLeft==p );
          assert( p->pLeft && p->pRight );
        }

        /* This loop runs once for each leaf in the tree of eType nodes. */
        while( 1 ){
          int iLvl;
          Fts3Expr *pParent = p->pParent;     /* Current parent of p */

          assert( pParent==0 || pParent->pLeft==p );
          p->pParent = 0;
          if( pParent ){
            pParent->pLeft = 0;
          }else{
            pRoot = 0;
          }
          rc = fts3ExprBalance(&p, nMaxDepth-1);
          if( rc!=SQLITE_OK ) break;

          for(iLvl=0; p && iLvl<nMaxDepth; iLvl++){
            if( apLeaf[iLvl]==0 ){
              apLeaf[iLvl] = p;
              p = 0;
            }else{
              assert( pFree );
              pFree->pLeft = apLeaf[iLvl];
              pFree->pRight = p;
              pFree->pLeft->pParent = pFree;
              pFree->pRight->pParent = pFree;

              p = pFree;
              pFree = pFree->pParent;
              p->pParent = 0;
              apLeaf[iLvl] = 0;
            }
          }
          if( p ){
            sqlite3Fts3ExprFree(p);
            rc = SQLITE_TOOBIG;
            break;
          }

          /* If that was the last leaf node, break out of the loop */
          if( pParent==0 ) break;

          /* Set $p to point to the next leaf in the tree of eType nodes */
          for(p=pParent->pRight; p->eType==eType; p=p->pLeft);

          /* Remove pParent from the original tree. */
          assert( pParent->pParent==0 || pParent->pParent->pLeft==pParent );
          pParent->pRight->pParent = pParent->pParent;
          if( pParent->pParent ){
            pParent->pParent->pLeft = pParent->pRight;
          }else{
            assert( pParent==pRoot );
            pRoot = pParent->pRight;
          }

          /* Link pParent into the free node list. It will be used as an
          ** internal node of the new tree.  */
          pParent->pParent = pFree;
          pFree = pParent;
        }

        if( rc==SQLITE_OK ){
          p = 0;
          for(i=0; i<nMaxDepth; i++){
            if( apLeaf[i] ){
              if( p==0 ){
                p = apLeaf[i];
                p->pParent = 0;
              }else{
                assert( pFree!=0 );
                pFree->pRight = p;
                pFree->pLeft = apLeaf[i];
                pFree->pLeft->pParent = pFree;
                pFree->pRight->pParent = pFree;

                p = pFree;
                pFree = pFree->pParent;
                p->pParent = 0;
              }
            }
          }
          pRoot = p;
        }else{
          /* An error occurred. Delete the contents of the apLeaf[] array
          ** and pFree list. Everything else is cleaned up by the call to
          ** sqlite3Fts3ExprFree(pRoot) below.  */
          Fts3Expr *pDel;
          for(i=0; i<nMaxDepth; i++){
            sqlite3Fts3ExprFree(apLeaf[i]);
          }
          while( (pDel=pFree)!=0 ){
            pFree = pDel->pParent;
            sqlite3_free(pDel);
          }
        }

        assert( pFree==0 );
        sqlite3_free( apLeaf );
      }
    }else if( eType==FTSQUERY_NOT ){
      Fts3Expr *pLeft = pRoot->pLeft;
      Fts3Expr *pRight = pRoot->pRight;

      pRoot->pLeft = 0;
      pRoot->pRight = 0;
      pLeft->pParent = 0;
      pRight->pParent = 0;

      rc = fts3ExprBalance(&pLeft, nMaxDepth-1);
      if( rc==SQLITE_OK ){
        rc = fts3ExprBalance(&pRight, nMaxDepth-1);
      }

      if( rc!=SQLITE_OK ){
        sqlite3Fts3ExprFree(pRight);
        sqlite3Fts3ExprFree(pLeft);
      }else{
        assert( pLeft && pRight );
        pRoot->pLeft = pLeft;
        pLeft->pParent = pRoot;
        pRoot->pRight = pRight;
        pRight->pParent = pRoot;
      }
    }
  }

  if( rc!=SQLITE_OK ){
    sqlite3Fts3ExprFree(pRoot);
    pRoot = 0;
  }
  *pp = pRoot;
  return rc;
}